

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pax_filename_encoding.c
# Opt level: O0

void test_pax_filename_encoding_KOI8R_CP1251(void)

{
  int iVar1;
  char *pcVar2;
  archive *_a;
  archive *a;
  
  pcVar2 = setlocale(6,"ru_RU.KOI8-R");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                   ,L'Ⱥ');
    test_skipping("KOI8-R locale not available on this system.");
  }
  else {
    _a = archive_write_new();
    iVar1 = archive_write_set_format_pax(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'ȿ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_pax(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options(_a,"hdrcharset=CP1251");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'ɂ',-0x19,"ARCHIVE_FAILED",(long)iVar1,
                        "archive_write_set_options(a, \"hdrcharset=CP1251\")",(void *)0x0);
    iVar1 = archive_write_free(_a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_pax_filename_encoding.c"
                        ,L'Ƀ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  }
  return;
}

Assistant:

DEFINE_TEST(test_pax_filename_encoding_KOI8R_CP1251)
{
  	struct archive *a;

	if (NULL == setlocale(LC_ALL, "ru_RU.KOI8-R")) {
		skipping("KOI8-R locale not available on this system.");
		return;
	}

	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_pax(a));
	/* pax format writer only accepts both BINARY and UTF-8. */
	assertEqualInt(ARCHIVE_FAILED,
	    archive_write_set_options(a, "hdrcharset=CP1251"));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
}